

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_error_string_
               (MPIABI_Fint *errorcode,char *string,int *resultlen,MPIABI_Fint *ierror,
               size_t string_len)

{
  mpi_error_string_();
  return;
}

Assistant:

void mpiabi_error_string_(
  const MPIABI_Fint * errorcode,
  char * string,
  int * resultlen,
  MPIABI_Fint * ierror,
  size_t string_len
) {
  return mpi_error_string_(
    errorcode,
    string,
    resultlen,
    ierror,
    string_len
  );
}